

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O1

void __thiscall OpenMD::HullFinder::HullFinder(HullFinder *this,SimInfo *info)

{
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer *pppSVar2;
  iterator iVar3;
  iterator __position;
  Molecule *pMVar4;
  pointer ppAVar5;
  pointer ppRVar6;
  pointer ppBVar7;
  pointer ppBVar8;
  pointer ppTVar9;
  pointer ppIVar10;
  Atom *pAVar11;
  RigidBody *pRVar12;
  Bond *pBVar13;
  Bend *pBVar14;
  Torsion *pTVar15;
  Inversion *pIVar16;
  pointer ppSVar17;
  MoleculeIterator mi;
  MoleculeIterator local_68;
  vector<int,_std::allocator<int>_> *local_60;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_58;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *local_50;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *local_48;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *local_40;
  StuntDouble *local_38;
  
  this->info_ = info;
  this_00 = &this->stuntdoubles_;
  local_48 = &this->bonds_;
  local_50 = &this->bends_;
  local_58 = &this->molecules_;
  pvVar1 = &this->nObjects_;
  local_40 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)&this->localSites_
  ;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(this_00,0,0xa8);
  local_68._M_node._0_4_ = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60 = pvVar1;
  if (iVar3._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,(int *)&local_68);
  }
  else {
    *iVar3._M_current = (int)local_68._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_68._M_node._0_4_ = this->info_->nGlobalBonds_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar3,(int *)&local_68);
  }
  else {
    *iVar3._M_current = (int)local_68._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_68._M_node._0_4_ = this->info_->nGlobalBends_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar3,(int *)&local_68);
  }
  else {
    *iVar3._M_current = (int)local_68._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_68._M_node._0_4_ = this->info_->nGlobalTorsions_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar3,(int *)&local_68);
  }
  else {
    *iVar3._M_current = (int)local_68._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_68._M_node._0_4_ = this->info_->nGlobalInversions_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar3,(int *)&local_68);
  }
  else {
    *iVar3._M_current = (int)local_68._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  pvVar1 = local_60;
  local_68._M_node._0_4_ = this->info_->nGlobalMols_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_60,iVar3,(int *)&local_68);
  }
  else {
    *iVar3._M_current = (int)local_68._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            (this_00,(long)*(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            (local_48,(long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[1]);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            (local_50,(long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[2]);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            (&this->torsions_,
             (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[3]);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            (&this->inversions_,
             (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[4]);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            (local_58,(long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[5]);
  local_68._M_node = (_Base_ptr)0x0;
  pMVar4 = SimInfo::beginMolecule(this->info_,&local_68);
  while (pMVar4 != (Molecule *)0x0) {
    (local_58->super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>)._M_impl.
    super__Vector_impl_data._M_start[pMVar4->globalIndex_] = pMVar4;
    ppSVar17 = (pMVar4->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar17 ==
        (pMVar4->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_38 = (StuntDouble *)0x0;
    }
    else {
      local_38 = *ppSVar17;
    }
    while (local_38 != (StuntDouble *)0x0) {
      ppSVar17 = ppSVar17 + 1;
      __position._M_current =
           (this->localSites_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->localSites_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
        _M_realloc_insert<OpenMD::StuntDouble*const&>(local_40,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppSVar2 = &(this->localSites_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppSVar2 = *pppSVar2 + 1;
      }
      if (ppSVar17 ==
          (pMVar4->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_38 = (StuntDouble *)0x0;
      }
      else {
        local_38 = *ppSVar17;
      }
    }
    ppAVar5 = (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar5 ==
        (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pAVar11 = (Atom *)0x0;
    }
    else {
      pAVar11 = *ppAVar5;
    }
    while (pAVar11 != (Atom *)0x0) {
      ppAVar5 = ppAVar5 + 1;
      (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pAVar11->super_StuntDouble).globalIndex_] =
           &pAVar11->super_StuntDouble;
      if (ppAVar5 ==
          (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar11 = (Atom *)0x0;
      }
      else {
        pAVar11 = *ppAVar5;
      }
    }
    ppRVar6 = (pMVar4->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar6 ==
        (pMVar4->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar12 = (RigidBody *)0x0;
    }
    else {
      pRVar12 = *ppRVar6;
    }
    while (pRVar12 != (RigidBody *)0x0) {
      ppRVar6 = ppRVar6 + 1;
      (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pRVar12->super_StuntDouble).globalIndex_] =
           &pRVar12->super_StuntDouble;
      if (ppRVar6 ==
          (pMVar4->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar12 = (RigidBody *)0x0;
      }
      else {
        pRVar12 = *ppRVar6;
      }
    }
    ppBVar7 = (pMVar4->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar7 ==
        (pMVar4->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pBVar13 = (Bond *)0x0;
    }
    else {
      pBVar13 = *ppBVar7;
    }
    while (pBVar13 != (Bond *)0x0) {
      ppBVar7 = ppBVar7 + 1;
      (local_48->super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(pBVar13->super_ShortRangeInteraction).globalIndex_] =
           pBVar13;
      if (ppBVar7 ==
          (pMVar4->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar13 = (Bond *)0x0;
      }
      else {
        pBVar13 = *ppBVar7;
      }
    }
    ppBVar8 = (pMVar4->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar8 ==
        (pMVar4->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pBVar14 = (Bend *)0x0;
    }
    else {
      pBVar14 = *ppBVar8;
    }
    while (pBVar14 != (Bend *)0x0) {
      ppBVar8 = ppBVar8 + 1;
      (local_50->super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(pBVar14->super_ShortRangeInteraction).globalIndex_] =
           pBVar14;
      if (ppBVar8 ==
          (pMVar4->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar14 = (Bend *)0x0;
      }
      else {
        pBVar14 = *ppBVar8;
      }
    }
    ppTVar9 = (pMVar4->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppTVar9 ==
        (pMVar4->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pTVar15 = (Torsion *)0x0;
    }
    else {
      pTVar15 = *ppTVar9;
    }
    while (pTVar15 != (Torsion *)0x0) {
      ppTVar9 = ppTVar9 + 1;
      (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_start[(pTVar15->super_ShortRangeInteraction).globalIndex_]
           = pTVar15;
      if (ppTVar9 ==
          (pMVar4->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar15 = (Torsion *)0x0;
      }
      else {
        pTVar15 = *ppTVar9;
      }
    }
    ppIVar10 = (pMVar4->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppIVar10 ==
        (pMVar4->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar16 = (Inversion *)0x0;
    }
    else {
      pIVar16 = *ppIVar10;
    }
    while (pIVar16 != (Inversion *)0x0) {
      ppIVar10 = ppIVar10 + 1;
      (this->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pIVar16->super_ShortRangeInteraction).globalIndex_] =
           pIVar16;
      if (ppIVar10 ==
          (pMVar4->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar16 = (Inversion *)0x0;
      }
      else {
        pIVar16 = *ppIVar10;
      }
    }
    pMVar4 = SimInfo::nextMolecule(this->info_,&local_68);
  }
  return;
}

Assistant:

HullFinder::HullFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      // Hull is constructed from all known integrable objects.
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        localSites_.push_back(sd);
      }

      // selection can include atoms (which may be a subset of the IOs)
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }

      // and rigid bodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }

      // These others are going to be inferred from the objects on the hull:
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
#ifdef HAVE_QHULL
    surfaceMesh_ = new ConvexHull();
#endif
  }